

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateStartStructMethod
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *code,IDLOptions *options)

{
  allocator<char> local_e4;
  allocator<char> local_e3;
  allocator<char> local_e2;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"start",&local_e1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_e2);
  IdlNamer::LegacyJavaMethod2(&local_60,&this->namer_,&local_80,struct_def,&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"builder: FlatBufferBuilder",&local_e3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e4);
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:899:9)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:899:9)>
             ::_M_manager;
  local_40._M_unused._M_object = code;
  local_40._8_8_ = struct_def;
  GenerateFunOneLine(code,&local_60,&local_c0,&local_e0,(function<void_()> *)&local_40,
                     options->gen_jvmstatic);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void GenerateStartStructMethod(StructDef &struct_def, CodeWriter &code,
                                 const IDLOptions options) const {
    GenerateFunOneLine(
        code, namer_.LegacyJavaMethod2("start", struct_def, ""),
        "builder: FlatBufferBuilder", "",
        [&]() {
          code += "builder.startTable(" +
                  NumToString(struct_def.fields.vec.size()) + ")";
        },
        options.gen_jvmstatic);
  }